

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O3

int64_t duckdb::Interval::GetNanoseconds(interval_t *val)

{
  bool bVar1;
  int64_t left;
  ConversionException *this;
  int64_t nano;
  int64_t local_48;
  string local_40;
  
  left = GetMicro(val);
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(left,1000,&local_48);
  if (bVar1) {
    return local_48;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Could not convert Interval to Nanoseconds","");
  ConversionException::ConversionException(this,&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t Interval::GetNanoseconds(const interval_t &val) {
	int64_t nano;
	const auto micro_total = GetMicro(val);
	if (!TryMultiplyOperator::Operation(micro_total, NANOS_PER_MICRO, nano)) {
		throw ConversionException("Could not convert Interval to Nanoseconds");
	}

	return nano;
}